

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduling_tests.hpp
# Opt level: O0

void test_parallel_group(void)

{
  element_type *this;
  task_handle *hTask;
  shared_ptr<oqpi::task_base> local_f8;
  task_handle local_e8;
  task_handle local_d8;
  shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>_>
  local_c8;
  task_handle local_b8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>_>
  spTask;
  int i;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
  spFork;
  test __t;
  
  test::test((test *)((long)&spFork.
                             super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7),"test_parallel_group");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Fork",&local_41);
  oqpi::
  helpers<oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
  ::make_parallel_group<(oqpi::task_type)1>((string *)local_20,(task_priority)local_40,2,gTaskCount)
  ;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  for (spTask.
       super___shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._0_4_ = 0;
      (int)spTask.
           super___shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi < gTaskCount;
      spTask.
      super___shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ =
           (int)spTask.
                super___shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi + 1) {
    std::__cxx11::to_string
              (&local_a8,
               (int)spTask.
                    super___shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
    std::operator+(&local_88,"FibonacciFork",&local_a8);
    oqpi::
    helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
    ::make_task_item<unsigned_long(&)(unsigned_long),unsigned_long_long_const&>
              ((helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                *)local_68,&local_88,fibonacci,&gValue);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    this = std::
           __shared_ptr_access<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
    std::
    shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task.hpp:151:18)>_>
    ::shared_ptr(&local_c8,
                 (shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>_>
                  *)local_68);
    oqpi::task_handle::
    task_handle<(oqpi::task_type)0,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::make_task<(oqpi::task_type)0,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>,oqpi::context_container<oqpi::task_base,timer_task_context>,unsigned_long(&)(unsigned_long),unsigned_long_long_const&>(std::__cxx11::string_const&,oqpi::task_priority,unsigned_long(&)(unsigned_long),unsigned_long_long_const&)::_lambda()_1_>
              (&local_b8,&local_c8);
    oqpi::
    task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
    ::addTask(&this->
               super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              ,&local_b8);
    oqpi::task_handle::~task_handle(&local_b8);
    std::
    shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task.hpp:151:18)>_>
    ::~shared_ptr(&local_c8);
    std::
    shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task.hpp:151:18)>_>
    ::~shared_ptr((shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>_>
                   *)local_68);
  }
  std::shared_ptr<oqpi::task_base>::
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,void>
            (&local_f8,
             (shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
              *)local_20);
  oqpi::task_handle::task_handle(&local_e8,&local_f8);
  hTask = &local_e8;
  oqpi::
  helpers<oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
  ::schedule_task((helpers<oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
                   *)&local_d8,hTask);
  oqpi::task_handle::wait(&local_d8,hTask);
  oqpi::task_handle::~task_handle(&local_d8);
  oqpi::task_handle::~task_handle(&local_e8);
  std::shared_ptr<oqpi::task_base>::~shared_ptr(&local_f8);
  std::
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
  ::~shared_ptr((shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
                 *)local_20);
  test::~test((test *)((long)&spFork.
                              super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi + 7));
  return;
}

Assistant:

void test_parallel_group()
{
    TEST_FUNC;

    auto spFork = oqpi_tk::make_parallel_group<oqpi::task_type::waitable>("Fork", oqpi::task_priority::normal, gTaskCount);
    for (auto i = 0; i < gTaskCount; ++i)
    {
        auto spTask = oqpi_tk::make_task_item("FibonacciFork" + std::to_string(i), fibonacci, gValue);
        spFork->addTask(spTask);
    }
    oqpi_tk::schedule_task(oqpi::task_handle(spFork)).wait();
}